

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::move_into(hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
            *this,node *pNode)

{
  char cVar1;
  uint uVar2;
  node *pDst;
  node *in_RSI;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  *in_RDI;
  int orig_index;
  node *pDst_node;
  int index;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  *in_stack_ffffffffffffffe0;
  uint local_14;
  
  uVar2 = hash_key(in_stack_ffffffffffffffe0,
                   (unsigned_long_long *)
                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  pDst = get_node(in_RDI,in_stack_ffffffffffffffcc);
  cVar1 = (pDst->super_value_type).field_0xc;
  local_14 = uVar2;
  while( true ) {
    if (cVar1 == '\0') {
      move_node(pDst,in_RSI);
      in_RDI->m_num_valid = in_RDI->m_num_valid + 1;
      return;
    }
    if (local_14 == 0) {
      local_14 = vector<crnlib::hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
                 ::size(&in_RDI->m_values);
      pDst = get_node(in_RDI,in_stack_ffffffffffffffcc);
    }
    else {
      pDst = pDst + -1;
    }
    local_14 = local_14 - 1;
    if (local_14 == uVar2) break;
    cVar1 = (pDst->super_value_type).field_0xc;
  }
  return;
}

Assistant:

inline void move_into(node* pNode) {
    int index = hash_key(pNode->first);
    node* pDst_node = &get_node(index);

    if (pDst_node->state) {
      const int orig_index = index;

      for (;;) {
        if (!index) {
          index = m_values.size() - 1;
          pDst_node = &get_node(index);
        } else {
          index--;
          pDst_node--;
        }

        if (index == orig_index) {
          CRNLIB_ASSERT(false);
          return;
        }

        if (!pDst_node->state)
          break;
      }
    }

    move_node(pDst_node, pNode);

    m_num_valid++;
  }